

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O0

int readImmediate(InternalInstruction *insn,uint8_t size)

{
  byte in_SIL;
  uint64_t *in_RDI;
  uint64_t imm64;
  uint32_t imm32;
  uint16_t imm16;
  uint8_t imm8;
  InternalInstruction *in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe8;
  ushort in_stack_ffffffffffffffec;
  byte in_stack_ffffffffffffffee;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if ((char)in_RDI[0x12] == '\x02') {
    iVar1 = -1;
  }
  else {
    if (in_SIL == 0) {
      in_SIL = *(byte *)((long)in_RDI + 0xf3);
    }
    else {
      *(byte *)((long)in_RDI + 0xf3) = in_SIL;
    }
    *(char *)((long)in_RDI + 0x97) = (char)(int)in_RDI[0x16] - (char)(int)in_RDI[0x1a];
    switch((uint8_t *)(ulong)(in_SIL - 1)) {
    case (uint8_t *)0x0:
      iVar1 = consumeByte(in_stack_ffffffffffffffe0,(uint8_t *)(ulong)(in_SIL - 1));
      if (iVar1 != 0) {
        return -1;
      }
      in_RDI[(ulong)(byte)in_RDI[0x12] + 0x23] = (ulong)in_stack_ffffffffffffffee;
      break;
    case (uint8_t *)0x1:
      iVar1 = consumeUInt16((InternalInstruction *)
                            CONCAT17(in_SIL,CONCAT16(in_stack_ffffffffffffffee,
                                                     CONCAT24(in_stack_ffffffffffffffec,
                                                              in_stack_ffffffffffffffe8))),
                            (uint16_t *)in_stack_ffffffffffffffe0);
      if (iVar1 != 0) {
        return -1;
      }
      in_RDI[(ulong)(byte)in_RDI[0x12] + 0x23] = (ulong)in_stack_ffffffffffffffec;
      break;
    case (uint8_t *)0x3:
      iVar1 = consumeUInt32((InternalInstruction *)
                            CONCAT17(in_SIL,CONCAT16(in_stack_ffffffffffffffee,
                                                     CONCAT24(in_stack_ffffffffffffffec,
                                                              in_stack_ffffffffffffffe8))),
                            (uint32_t *)in_stack_ffffffffffffffe0);
      if (iVar1 != 0) {
        return -1;
      }
      in_RDI[(ulong)(byte)in_RDI[0x12] + 0x23] = (ulong)in_stack_ffffffffffffffe8;
      break;
    case (uint8_t *)0x7:
      iVar1 = consumeUInt64((InternalInstruction *)
                            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
      if (iVar1 != 0) {
        return -1;
      }
      in_RDI[(ulong)(byte)in_RDI[0x12] + 0x23] = (uint64_t)in_stack_ffffffffffffffe0;
    }
    *(char *)(in_RDI + 0x12) = (char)in_RDI[0x12] + '\x01';
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int readImmediate(struct InternalInstruction *insn, uint8_t size)
{
	uint8_t imm8;
	uint16_t imm16;
	uint32_t imm32;
	uint64_t imm64;

	// dbgprintf(insn, "readImmediate()");

	if (insn->numImmediatesConsumed == 2) {
		//debug("Already consumed two immediates");
		return -1;
	}

	if (size == 0)
		size = insn->immediateSize;
	else
		insn->immediateSize = size;
	insn->immediateOffset = (uint8_t)(insn->readerCursor - insn->startLocation);

	switch (size) {
		case 1:
			if (consumeByte(insn, &imm8))
				return -1;
			insn->immediates[insn->numImmediatesConsumed] = imm8;
			break;
		case 2:
			if (consumeUInt16(insn, &imm16))
				return -1;
			insn->immediates[insn->numImmediatesConsumed] = imm16;
			break;
		case 4:
			if (consumeUInt32(insn, &imm32))
				return -1;
			insn->immediates[insn->numImmediatesConsumed] = imm32;
			break;
		case 8:
			if (consumeUInt64(insn, &imm64))
				return -1;
			insn->immediates[insn->numImmediatesConsumed] = imm64;
			break;
	}

	insn->numImmediatesConsumed++;

	return 0;
}